

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  pointer pMVar1;
  cmCommand *pcVar2;
  bool bVar3;
  ostream *poVar4;
  char *__s;
  char *pcVar5;
  mode_t *permissions;
  string regex;
  ostringstream e;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [72];
  char *local_e8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [9];
  
  switch(this->Doing) {
  case 2:
    if ((arg->_M_string_length == 0) ||
       (bVar3 = cmsys::SystemTools::FileIsFullPath((arg->_M_dataplus)._M_p), bVar3)) {
      std::__cxx11::string::_M_assign((string *)&this->Destination);
    }
    else {
      __s = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      pcVar5 = (char *)(this->Destination)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->Destination,0,pcVar5,(ulong)__s);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "/",arg);
      std::__cxx11::string::_M_append((char *)&this->Destination,local_1a0._0_8_);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
    }
    goto LAB_0029060a;
  case 3:
    if ((arg->_M_string_length == 0) ||
       (bVar3 = cmsys::SystemTools::FileIsFullPath((arg->_M_dataplus)._M_p), bVar3)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,arg);
      return true;
    }
    pcVar5 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
    std::__cxx11::string::string((string *)local_1a0,pcVar5,(allocator *)&local_1e0);
    std::operator+(&local_1e0,"/",arg);
    std::__cxx11::string::_M_append(local_1a0,(ulong)local_1e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)local_1a0);
    local_1e0.field_2._M_allocated_capacity = local_1a0._16_8_;
    if ((undefined1 *)local_1a0._0_8_ == local_1a0 + 0x10) {
      return true;
    }
    goto LAB_0029069e;
  case 4:
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"/","");
    cmsys::Glob::PatternToRegex((string *)local_1a0,arg,false,false);
    std::__cxx11::string::_M_append((char *)&local_1e0,local_1a0._0_8_);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_1e0);
    MatchRule::MatchRule((MatchRule *)local_1a0,&local_1e0);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::
    emplace_back<cmFileCopier::MatchRule>(&this->MatchRules,(MatchRule *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != local_b8) {
      operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
    }
    if (local_e8 != (char *)0x0) {
      operator_delete__(local_e8);
    }
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"could not compile PATTERN \"",0x1b);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    else {
      this->Doing = 0;
    }
    local_1a0._0_8_ = local_1e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
      return true;
    }
LAB_0029069e:
    operator_delete((void *)local_1a0._0_8_,local_1e0.field_2._M_allocated_capacity + 1);
    return true;
  case 5:
    MatchRule::MatchRule((MatchRule *)local_1a0,arg);
    std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::
    emplace_back<cmFileCopier::MatchRule>(&this->MatchRules,(MatchRule *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != local_b8) {
      operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
    }
    if (local_e8 != (char *)0x0) {
      operator_delete__(local_e8);
    }
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"could not compile REGEX \"",0x19);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      return true;
    }
LAB_0029060a:
    this->Doing = 0;
    return true;
  case 6:
    permissions = &this->FilePermissions;
    break;
  case 7:
    permissions = &this->DirPermissions;
    break;
  case 8:
    permissions = &(this->CurrentMatchRule->Properties).Permissions;
    break;
  default:
    return false;
  }
  bVar3 = CheckPermissions(this,arg,permissions);
  if (!bVar3) {
    this->Doing = 1;
    return true;
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch(this->Doing)
    {
    case DoingFiles:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Files.push_back(arg);
        }
      else
        {
        std::string file = this->Makefile->GetCurrentSourceDirectory();
        file += "/" + arg;
        this->Files.push_back(file);
        }
      break;
    case DoingDestination:
      if(arg.empty() || cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        this->Destination = arg;
        }
      else
        {
        this->Destination = this->Makefile->GetCurrentBinaryDirectory();
        this->Destination += "/" + arg;
        }
      this->Doing = DoingNone;
      break;
    case DoingPattern:
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex = "/";
      regex += cmsys::Glob::PatternToRegex(arg, false);
      regex += "$";
      this->MatchRules.push_back(MatchRule(regex));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      }
      break;
    case DoingRegex:
      this->MatchRules.push_back(MatchRule(arg));
      this->CurrentMatchRule = &*(this->MatchRules.end()-1);
      if(this->CurrentMatchRule->Regex.is_valid())
        {
        this->Doing = DoingNone;
        }
      else
        {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsFile:
      if(!this->CheckPermissions(arg, this->FilePermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsDir:
      if(!this->CheckPermissions(arg, this->DirPermissions))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingPermissionsMatch:
      if(!this->CheckPermissions(
           arg, this->CurrentMatchRule->Properties.Permissions))
        {
        this->Doing = DoingError;
        }
      break;
    default:
      return false;
    }
  return true;
}